

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_extr_i64_i32_riscv64
               (TCGContext_conflict11 *tcg_ctx,TCGv_i32 lo,TCGv_i32 hi,TCGv_i64 arg)

{
  TCGOp *pTVar1;
  uintptr_t o_1;
  uintptr_t o;
  
  if (lo != (TCGv_i32)arg) {
    pTVar1 = tcg_emit_op_riscv64(tcg_ctx,INDEX_op_mov_i32);
    pTVar1->args[0] = (TCGArg)(lo + (long)tcg_ctx);
    pTVar1->args[1] = (TCGArg)(arg + (long)&tcg_ctx->pool_cur);
  }
  tcg_gen_extrh_i64_i32_riscv64(tcg_ctx,hi,arg);
  return;
}

Assistant:

void tcg_gen_extr_i64_i32(TCGContext *tcg_ctx, TCGv_i32 lo, TCGv_i32 hi, TCGv_i64 arg)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_mov_i32(tcg_ctx, lo, TCGV_LOW(tcg_ctx, arg));
        tcg_gen_mov_i32(tcg_ctx, hi, TCGV_HIGH(tcg_ctx, arg));
#else
        tcg_gen_extrl_i64_i32(tcg_ctx, lo, arg);
        tcg_gen_extrh_i64_i32(tcg_ctx, hi, arg);
#endif
}